

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O0

char * borg_must_return_to_town(void)

{
  char *local_10;
  
  if (borg.trait[0x69] == 0) {
    local_10 = (char *)0x0;
  }
  else if ((borg_t - borg_began < 100) && (borg.trait[0x69] != 100)) {
    local_10 = (char *)0x0;
  }
  else {
    local_10 = borg_restock(borg.trait[0x69]);
  }
  return local_10;
}

Assistant:

extern const char *borg_must_return_to_town(void)
{
    /* don't need to go to town if in town */
    if (borg.trait[BI_CDEPTH] == 0)
        return ((char *)NULL);

    /* Always spend time on a level unless 100*/
    if (borg_t - borg_began < 100 && borg.trait[BI_CDEPTH] != 100)
        return ((char *)NULL);

    /* need to return to town if restock is needed */
    return borg_restock(borg.trait[BI_CDEPTH]);
}